

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O1

int TeleportGetNumBuffered(int stream)

{
  int iVar1;
  int iVar2;
  
  if (Teleport::GetSharedMemory()::shared == '\0') {
    iVar1 = __cxa_guard_acquire(&Teleport::GetSharedMemory()::shared);
    if (iVar1 != 0) {
      Teleport::SharedMemoryHandle::SharedMemoryHandle
                ((SharedMemoryHandle *)&Teleport::GetSharedMemory()::shared);
      __cxa_atexit(Teleport::SharedMemoryHandle::~SharedMemoryHandle,
                   &Teleport::GetSharedMemory()::shared,&__dso_handle);
      __cxa_guard_release(&Teleport::GetSharedMemory()::shared);
    }
  }
  iVar2 = *(int *)(Teleport::GetSharedMemory()::shared + 0x24 + (long)stream * 0x56248) -
          *(int *)(Teleport::GetSharedMemory()::shared + 0x20 + (long)stream * 0x56248);
  iVar1 = iVar2 + 0x15888;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API int TeleportGetNumBuffered(int stream)
{
    Teleport::Stream& s = Teleport::GetSharedMemory()->streams[stream];
    return s.GetNumBuffered();
}